

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSplit.c
# Opt level: O0

Vec_Int_t * Spl_ManFromWecMapping(Gia_Man_t *p,Vec_Wec_t *vMap)

{
  int iVar1;
  int iVar2;
  int iVar3;
  Vec_Int_t *p_00;
  Vec_Int_t *p_01;
  int local_30;
  int Obj;
  int k;
  int i;
  Vec_Int_t *vVec;
  Vec_Int_t *vMapping;
  Vec_Wec_t *vMap_local;
  Gia_Man_t *p_local;
  
  iVar1 = Gia_ManHasMapping2(p);
  if (iVar1 == 0) {
    __assert_fail("Gia_ManHasMapping2(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaSplit.c"
                  ,0x52,"Vec_Int_t *Spl_ManFromWecMapping(Gia_Man_t *, Vec_Wec_t *)");
  }
  iVar1 = Gia_ManObjNum(p);
  iVar2 = Vec_WecSizeSize(vMap);
  iVar3 = Vec_WecSizeUsed(vMap);
  p_00 = Vec_IntAlloc(iVar1 + iVar2 + iVar3 * 2);
  iVar1 = Gia_ManObjNum(p);
  Vec_IntFill(p_00,iVar1,0);
  for (Obj = 0; iVar1 = Vec_WecSize(vMap), Obj < iVar1; Obj = Obj + 1) {
    p_01 = Vec_WecEntry(vMap,Obj);
    iVar1 = Vec_IntSize(p_01);
    if (0 < iVar1) {
      iVar1 = Vec_IntSize(p_00);
      Vec_IntWriteEntry(p_00,Obj,iVar1);
      iVar1 = Vec_IntSize(p_01);
      Vec_IntPush(p_00,iVar1);
      for (local_30 = 0; iVar1 = Vec_IntSize(p_01), local_30 < iVar1; local_30 = local_30 + 1) {
        iVar1 = Vec_IntEntry(p_01,local_30);
        Vec_IntPush(p_00,iVar1);
      }
      Vec_IntPush(p_00,Obj);
    }
  }
  iVar1 = Vec_IntSize(p_00);
  if (0xf < iVar1) {
    iVar1 = Vec_IntSize(p_00);
    iVar2 = Vec_IntCap(p_00);
    if (iVar1 != iVar2) {
      __assert_fail("Vec_IntSize(vMapping) < 16 || Vec_IntSize(vMapping) == Vec_IntCap(vMapping)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaSplit.c"
                    ,0x5e,"Vec_Int_t *Spl_ManFromWecMapping(Gia_Man_t *, Vec_Wec_t *)");
    }
  }
  return p_00;
}

Assistant:

Vec_Int_t * Spl_ManFromWecMapping( Gia_Man_t * p, Vec_Wec_t * vMap )
{
    Vec_Int_t * vMapping, * vVec; int i, k, Obj;
    assert( Gia_ManHasMapping2(p) );
    vMapping = Vec_IntAlloc( Gia_ManObjNum(p) + Vec_WecSizeSize(vMap) + 2*Vec_WecSizeUsed(vMap) );
    Vec_IntFill( vMapping, Gia_ManObjNum(p), 0 );
    Vec_WecForEachLevel( vMap, vVec, i )
        if ( Vec_IntSize(vVec) > 0 )
        {
            Vec_IntWriteEntry( vMapping, i, Vec_IntSize(vMapping) );
            Vec_IntPush( vMapping, Vec_IntSize(vVec) );
            Vec_IntForEachEntry( vVec, Obj, k )
                Vec_IntPush( vMapping, Obj );
            Vec_IntPush( vMapping, i );
        }
    assert( Vec_IntSize(vMapping) < 16 || Vec_IntSize(vMapping) == Vec_IntCap(vMapping) );
    return vMapping;
}